

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

Ref<anurbs::BrepTrim> __thiscall
pybind11::detail::
argument_loader<anurbs::Model&,std::shared_ptr<anurbs::BrepTrim>,std::__cxx11::string_const&>::
call_impl<anurbs::Ref<anurbs::BrepTrim>,anurbs::Ref<anurbs::BrepTrim>(*&)(anurbs::Model&,std::shared_ptr<anurbs::BrepTrim>,std::__cxx11::string_const&),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,std::shared_ptr<anurbs::BrepTrim>,std::__cxx11::string_const&>
           *this,tuple<pybind11::detail::type_caster<anurbs::Model,_void>,_pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepTrim>,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                 *f,void_type *param_3,undefined8 param_4)

{
  code *pcVar1;
  __tuple_element_t<0UL,_tuple<type_caster<Model,_void>,_type_caster<shared_ptr<BrepTrim>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster;
  template_cast_op_type<typename_std::add_rvalue_reference<Model_&>::type> pMVar2;
  __tuple_element_t<1UL,_tuple<type_caster<Model,_void>,_type_caster<shared_ptr<BrepTrim>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_00;
  template_cast_op_type<typename_std::add_rvalue_reference<shared_ptr<BrepTrim>_>::type> psVar3;
  __tuple_element_t<2UL,_tuple<type_caster<Model,_void>,_type_caster<shared_ptr<BrepTrim>,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_01;
  template_cast_op_type<typename_std::add_rvalue_reference<const_basic_string<char>_&>::type> pbVar4
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepTrim> RVar5;
  shared_ptr<anurbs::BrepTrim> local_40;
  undefined8 local_30;
  void_type *param_3_local;
  _func_Ref<anurbs::BrepTrim>_Model_ptr_shared_ptr<anurbs::BrepTrim>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **f_local;
  argument_loader<anurbs::Model_&,_std::shared_ptr<anurbs::BrepTrim>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  argument_loader<anurbs::Model&,std::shared_ptr<anurbs::BrepTrim>,std::__cxx11::string_const&>
  *local_10;
  
  pcVar1 = *(code **)param_3;
  local_30 = param_4;
  param_3_local = param_3;
  f_local = (_func_Ref<anurbs::BrepTrim>_Model_ptr_shared_ptr<anurbs::BrepTrim>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
             **)f;
  local_10 = this;
  caster = std::
           get<0ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepTrim>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                     (f);
  pMVar2 = cast_op<anurbs::Model&>(caster);
  caster_00 = std::
              get<1ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepTrim>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        (f);
  psVar3 = cast_op<std::shared_ptr<anurbs::BrepTrim>>(caster_00);
  std::shared_ptr<anurbs::BrepTrim>::shared_ptr(&local_40,psVar3);
  caster_01 = std::
              get<2ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::BrepTrim>,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        (f);
  pbVar4 = cast_op<std::__cxx11::string_const&>(caster_01);
  (*pcVar1)(this,pMVar2,&local_40,pbVar4);
  std::shared_ptr<anurbs::BrepTrim>::~shared_ptr(&local_40);
  RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepTrim>)
         RVar5.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }